

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O1

put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
* __thiscall
density::
sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
::
start_emplace<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>
          (put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
           *__return_storage_ptr__,
          sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
          *this)

{
  void *pvVar1;
  uintptr_t uint_pointer;
  InstanceCounted *this_00;
  Allocation push_data;
  Allocation local_30;
  
  detail::
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,24ul,8ul>
            (&local_30,this);
  this_00 = (InstanceCounted *)(local_30.m_control_block + 1);
  density_tests::InstanceCounted::new_instance(this_00);
  pvVar1 = local_30.m_user_storage;
  *(undefined1 **)this_00 =
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>
       ::s_table;
  *(undefined8 *)local_30.m_user_storage = 0;
  *(undefined8 *)((long)local_30.m_user_storage + 8) = 0;
  *(undefined8 *)((long)local_30.m_user_storage + 0x10) = 0;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)local_30.m_user_storage);
  *(undefined8 *)pvVar1 = 0;
  *(undefined8 *)((long)pvVar1 + 8) = 0;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  (__return_storage_ptr__->m_put).m_control_block = local_30.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_30.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_30.m_user_storage;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();

                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }